

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.h
# Opt level: O3

void __thiscall sptk::SymmetricMatrix::~SymmetricMatrix(SymmetricMatrix *this)

{
  pointer ppdVar1;
  pointer pdVar2;
  
  this->_vptr_SymmetricMatrix = (_func_int **)&PTR__SymmetricMatrix_00112d58;
  ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppdVar1 != (pointer)0x0) {
    operator_delete(ppdVar1);
  }
  pdVar2 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
    return;
  }
  return;
}

Assistant:

virtual ~SymmetricMatrix() {
  }